

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_casts.cpp
# Opt level: O1

bool duckdb::ArrayToListCast(Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  BoundCastData *pBVar1;
  unsigned_long *puVar2;
  undefined1 uVar3;
  idx_t iVar4;
  Vector *pVVar5;
  Vector *pVVar6;
  list_entry_t *plVar7;
  idx_t iVar8;
  ulong idx;
  uint64_t *puVar9;
  
  optional_ptr<duckdb::BoundCastData,_true>::CheckValid(&parameters->cast_data);
  pBVar1 = (parameters->cast_data).ptr;
  Vector::Flatten(source,count);
  iVar4 = ArrayType::GetSize(&source->type);
  iVar8 = iVar4 * count;
  ListVector::Reserve(result,iVar8);
  ListVector::SetListSize(result,iVar8);
  pVVar5 = ArrayVector::GetEntry(source);
  pVVar6 = ListVector::GetEntry(result);
  uVar3 = (*(code *)pBVar1[1]._vptr_BoundCastData)(pVVar5,pVVar6,iVar8);
  plVar7 = ListVector::GetData(result);
  if (count != 0) {
    puVar9 = &plVar7->length;
    iVar8 = 0;
    idx = 0;
    do {
      puVar2 = (source->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar2 == (unsigned_long *)0x0) || ((puVar2[idx >> 6] >> (idx & 0x3f) & 1) != 0)) {
        ((list_entry_t *)(puVar9 + -1))->offset = iVar8;
        *puVar9 = iVar4;
      }
      else {
        FlatVector::SetNull(result,idx,true);
      }
      idx = idx + 1;
      puVar9 = puVar9 + 2;
      iVar8 = iVar8 + iVar4;
    } while (count != idx);
    if (count == 1) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
    }
  }
  return (bool)uVar3;
}

Assistant:

static bool ArrayToListCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto &cast_data = parameters.cast_data->Cast<ArrayBoundCastData>();

	// FIXME: dont flatten
	source.Flatten(count);

	auto array_size = ArrayType::GetSize(source.GetType());
	auto child_count = count * array_size;

	ListVector::Reserve(result, child_count);
	ListVector::SetListSize(result, child_count);

	auto &source_child = ArrayVector::GetEntry(source);
	auto &result_child = ListVector::GetEntry(result);

	CastParameters child_parameters(parameters, cast_data.child_cast_info.cast_data, parameters.local_state);
	bool all_ok = cast_data.child_cast_info.function(source_child, result_child, child_count, child_parameters);

	auto list_data = ListVector::GetData(result);
	for (idx_t i = 0; i < count; i++) {
		if (FlatVector::IsNull(source, i)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}

		list_data[i].offset = i * array_size;
		list_data[i].length = array_size;
	}

	if (count == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}

	return all_ok;
}